

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O1

void __thiscall PerseusStationary::SetBeliefSet(PerseusStationary *this,BeliefSet *S)

{
  undefined8 *puVar1;
  void *pvVar2;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *this_00;
  
  if (((this->super_Perseus)._m_beliefsInitialized == true) &&
     (puVar1 = *(undefined8 **)&(this->super_Perseus).field_0xc0, puVar1 != (undefined8 *)0x0)) {
    pvVar2 = (void *)*puVar1;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,puVar1[2] - (long)pvVar2);
    }
    operator_delete(puVar1,0x18);
  }
  this_00 = (vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
            operator_new(0x18);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector(this_00,S);
  *(vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> **)
   &(this->super_Perseus).field_0xc0 = this_00;
  (this->super_Perseus)._m_beliefsInitialized = true;
  return;
}

Assistant:

void PerseusStationary::SetBeliefSet(const BeliefSet &S)
{
    if(_m_beliefsInitialized)
        delete(_m_beliefs);
    _m_beliefs=new BeliefSet(S);
    _m_beliefsInitialized=true;
}